

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O3

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::TestBody
          (ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
           *this)

{
  void *pvVar1;
  Particle<(pica::Dimension)2> particle;
  bool bVar2;
  long lVar3;
  int i;
  int iVar4;
  char *message;
  PositionType minPosition;
  PositionType maxPosition;
  int numParticles;
  AssertionResult gtest_ar;
  ParticleArray particles;
  Message local_148;
  int local_13c;
  AssertHelper local_138;
  internal local_130 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  undefined1 local_120 [40];
  FactorType FStack_f8;
  GammaType local_f0;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>> aPStack_e8 [8];
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>> local_e0 [120];
  void *local_68;
  long local_58;
  void *local_50;
  long local_40;
  void *local_38;
  long local_30;
  long local_28;
  
  iVar4 = 0;
  memset(local_e0,0,0xc0);
  local_13c = 0xc;
  do {
    minPosition.y = -10.0;
    minPosition.x = -10.0;
    maxPosition.y = 10.0;
    maxPosition.x = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              ((Particle *)local_120,
               (BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this,minPosition,
               maxPosition);
    particle.position.y = (double)local_120._8_8_;
    particle.position.x = (double)local_120._0_8_;
    particle.p.x = (double)local_120._16_8_;
    particle.p.y = (double)local_120._24_8_;
    particle.p.z = (double)local_120._32_8_;
    particle.factor = FStack_f8;
    particle.invGamma = local_f0;
    particle._56_8_ = aPStack_e8;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::
    pushBack<pica::Particle<(pica::Dimension)2>>(local_e0,particle);
    iVar4 = iVar4 + 1;
  } while (iVar4 < local_13c);
  local_148.ss_.ptr_._0_4_ = (undefined4)((ulong)(local_30 - (long)local_38) >> 1);
  testing::internal::CmpHelperEQ<int,int>
            (local_130,"numParticles","particles.size()",&local_13c,(int *)&local_148);
  if (local_130[0] == (internal)0x0) {
    testing::Message::Message(&local_148);
    if (local_128.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_128.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x45,message);
    testing::internal::AssertHelper::operator=(&local_138,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    if (CONCAT44(local_148.ss_.ptr_._4_4_,local_148.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_148.ss_.ptr_._4_4_,local_148.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_148.ss_.ptr_._4_4_,local_148.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_128,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_38 != (void *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  if (local_50 != (void *)0x0) {
    operator_delete(local_50,local_40 - (long)local_50);
  }
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  lVar3 = 0x70;
  do {
    pvVar1 = *(void **)(local_e0 + lVar3 + -0x10);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)(local_e0 + lVar3) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0x28);
  lVar3 = 0x30;
  do {
    pvVar1 = *(void **)(local_e0 + lVar3 + -0x18);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)(local_e0 + lVar3 + -8) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}